

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuckoocache_tests.cpp
# Opt level: O1

void __thiscall
cuckoocache_tests::GenerationsTest::
test_cache_generations<CuckooCache::cache<uint256,SignatureCacheHasher>>(GenerationsTest *this)

{
  pointer *ppuVar1;
  pointer puVar2;
  atomic<unsigned_char> *paVar3;
  uchar *puVar4;
  pointer puVar5;
  _Elt_pointer pbVar6;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  uint uVar10;
  _Map_pointer ppbVar11;
  _Elt_pointer in_R8;
  uint32_t k;
  uint uVar12;
  iterator in_R9;
  bool bVar13;
  ulong uVar14;
  uint32_t i;
  int iVar15;
  uint uVar16;
  long in_FS_OFFSET;
  double dVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  const_string file;
  const_string file_00;
  const_string msg;
  const_string msg_00;
  deque<block_activity,_std::allocator<block_activity>_> last_few;
  vector<block_activity,_std::allocator<block_activity>_> hashes;
  uint32_t BLOCK_SIZE;
  cache<uint256,_SignatureCacheHasher> set;
  check_type cVar23;
  char *local_1b0;
  char *local_1a8;
  undefined1 *local_1a0;
  undefined1 *local_198;
  char *local_190;
  char *local_188;
  char *local_180;
  char *local_178;
  char *local_170;
  char *local_168;
  assertion_result local_160;
  undefined1 *local_148;
  undefined1 *local_140;
  char *local_138;
  char *local_130;
  _Deque_base<block_activity,_std::allocator<block_activity>_> local_128;
  vector<block_activity,_std::allocator<block_activity>_> local_d8;
  uint local_bc;
  cache<uint256,_SignatureCacheHasher> local_b8;
  lazy_ostream local_58;
  undefined8 local_48;
  undefined8 local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  BasicTestingSetup::SeedRandomForTest(&this->super_BasicTestingSetup,ZEROS);
  local_bc = 1000;
  local_d8.super__Vector_base<block_activity,_std::allocator<block_activity>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_d8.super__Vector_base<block_activity,_std::allocator<block_activity>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_d8.super__Vector_base<block_activity,_std::allocator<block_activity>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  CuckooCache::cache<uint256,_SignatureCacheHasher>::cache(&local_b8);
  CuckooCache::cache<uint256,_SignatureCacheHasher>::setup(&local_b8,0x20000);
  std::vector<block_activity,_std::allocator<block_activity>_>::reserve(&local_d8,0x51e);
  local_128._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  local_128._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  local_128._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  local_128._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  local_128._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  local_128._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_128._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  local_128._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  local_128._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_128._M_impl.super__Deque_impl_data._M_map_size = 0;
  std::_Deque_base<block_activity,_std::allocator<block_activity>_>::_M_initialize_map(&local_128,0)
  ;
  uVar16 = 0;
  iVar15 = 0;
  do {
    if (((long)local_128._M_impl.super__Deque_impl_data._M_start._M_last -
         (long)local_128._M_impl.super__Deque_impl_data._M_start._M_cur >> 3) * -0x5555555555555555
        + ((long)local_128._M_impl.super__Deque_impl_data._M_finish._M_cur -
           (long)local_128._M_impl.super__Deque_impl_data._M_finish._M_first >> 3) *
          -0x5555555555555555 +
        (((long)local_128._M_impl.super__Deque_impl_data._M_finish._M_node -
          (long)local_128._M_impl.super__Deque_impl_data._M_start._M_node >> 3) + -1 +
        (ulong)(local_128._M_impl.super__Deque_impl_data._M_finish._M_node == (_Map_pointer)0x0)) *
        0x15 == 0x3c) {
      std::deque<block_activity,_std::allocator<block_activity>_>::pop_front
                ((deque<block_activity,_std::allocator<block_activity>_> *)&local_128);
    }
    std::
    deque<cuckoocache_tests::GenerationsTest::test_cache_generations<CuckooCache::cache<uint256,SignatureCacheHasher>>()::block_activity,std::allocator<cuckoocache_tests::GenerationsTest::test_cache_generations<CuckooCache::cache<uint256,SignatureCacheHasher>>()::block_activity>>
    ::
    emplace_back<unsigned_int_const&,FastRandomContext&,CuckooCache::cache<uint256,SignatureCacheHasher>&>
              ((deque<cuckoocache_tests::GenerationsTest::test_cache_generations<CuckooCache::cache<uint256,SignatureCacheHasher>>()::block_activity,std::allocator<cuckoocache_tests::GenerationsTest::test_cache_generations<CuckooCache::cache<uint256,SignatureCacheHasher>>()::block_activity>>
                *)&local_128,&local_bc,&(this->super_BasicTestingSetup).m_rng,&local_b8);
    if (local_128._M_impl.super__Deque_impl_data._M_start._M_cur ==
        local_128._M_impl.super__Deque_impl_data._M_finish._M_cur) {
      dVar17 = 0.0;
    }
    else {
      uVar10 = 0;
      pbVar6 = local_128._M_impl.super__Deque_impl_data._M_start._M_cur;
      ppbVar11 = local_128._M_impl.super__Deque_impl_data._M_start._M_node;
      in_R8 = local_128._M_impl.super__Deque_impl_data._M_start._M_last;
      do {
        in_R9 = (iterator)0x0;
        do {
          puVar5 = (pbVar6->reads).super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                   super__Vector_impl_data._M_finish;
          uVar14 = (ulong)local_b8.size;
          uVar8 = *(uint *)puVar5[-1].super_base_blob<256U>.m_data._M_elems * uVar14;
          uVar9 = uVar8 >> 0x20;
          local_58._vptr_lazy_ostream =
               (_func_int **)
               CONCAT44((int)(*(uint *)(puVar5[-1].super_base_blob<256U>.m_data._M_elems + 4) *
                              uVar14 >> 0x20),(int)(uVar8 >> 0x20));
          local_58._8_4_ =
               (uint)(*(uint *)(puVar5[-1].super_base_blob<256U>.m_data._M_elems + 8) * uVar14 >>
                     0x20);
          local_58._12_4_ =
               (int)(*(uint *)(puVar5[-1].super_base_blob<256U>.m_data._M_elems + 0xc) * uVar14 >>
                    0x20);
          local_48 = (undefined1 *)
                     CONCAT44((int)(*(uint *)(puVar5[-1].super_base_blob<256U>.m_data._M_elems +
                                             0x14) * uVar14 >> 0x20),
                              (int)(*(uint *)(puVar5[-1].super_base_blob<256U>.m_data._M_elems +
                                             0x10) * uVar14 >> 0x20));
          local_40 = (char **)CONCAT44((int)(*(uint *)(puVar5[-1].super_base_blob<256U>.m_data.
                                                       _M_elems + 0x1c) * uVar14 >> 0x20),
                                       (int)(*(uint *)(puVar5[-1].super_base_blob<256U>.m_data.
                                                       _M_elems + 0x18) * uVar14 >> 0x20));
          puVar2 = local_b8.table.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                   super__Vector_impl_data._M_start + uVar9;
          puVar4 = local_b8.table.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar9].super_base_blob<256U>.m_data._M_elems +
                   0x10;
          auVar21[0] = -(puVar5[-1].super_base_blob<256U>.m_data._M_elems[0] ==
                        (puVar2->super_base_blob<256U>).m_data._M_elems[0]);
          auVar21[1] = -(puVar5[-1].super_base_blob<256U>.m_data._M_elems[1] ==
                        (puVar2->super_base_blob<256U>).m_data._M_elems[1]);
          auVar21[2] = -(puVar5[-1].super_base_blob<256U>.m_data._M_elems[2] ==
                        (puVar2->super_base_blob<256U>).m_data._M_elems[2]);
          auVar21[3] = -(puVar5[-1].super_base_blob<256U>.m_data._M_elems[3] ==
                        (puVar2->super_base_blob<256U>).m_data._M_elems[3]);
          auVar21[4] = -(puVar5[-1].super_base_blob<256U>.m_data._M_elems[4] ==
                        (puVar2->super_base_blob<256U>).m_data._M_elems[4]);
          auVar21[5] = -(puVar5[-1].super_base_blob<256U>.m_data._M_elems[5] ==
                        (puVar2->super_base_blob<256U>).m_data._M_elems[5]);
          auVar21[6] = -(puVar5[-1].super_base_blob<256U>.m_data._M_elems[6] ==
                        (puVar2->super_base_blob<256U>).m_data._M_elems[6]);
          auVar21[7] = -(puVar5[-1].super_base_blob<256U>.m_data._M_elems[7] ==
                        (puVar2->super_base_blob<256U>).m_data._M_elems[7]);
          auVar21[8] = -(puVar5[-1].super_base_blob<256U>.m_data._M_elems[8] ==
                        (puVar2->super_base_blob<256U>).m_data._M_elems[8]);
          auVar21[9] = -(puVar5[-1].super_base_blob<256U>.m_data._M_elems[9] ==
                        (puVar2->super_base_blob<256U>).m_data._M_elems[9]);
          auVar21[10] = -(puVar5[-1].super_base_blob<256U>.m_data._M_elems[10] ==
                         (puVar2->super_base_blob<256U>).m_data._M_elems[10]);
          auVar21[0xb] = -(puVar5[-1].super_base_blob<256U>.m_data._M_elems[0xb] ==
                          (puVar2->super_base_blob<256U>).m_data._M_elems[0xb]);
          auVar21[0xc] = -(puVar5[-1].super_base_blob<256U>.m_data._M_elems[0xc] ==
                          (puVar2->super_base_blob<256U>).m_data._M_elems[0xc]);
          auVar21[0xd] = -(puVar5[-1].super_base_blob<256U>.m_data._M_elems[0xd] ==
                          (puVar2->super_base_blob<256U>).m_data._M_elems[0xd]);
          auVar21[0xe] = -(puVar5[-1].super_base_blob<256U>.m_data._M_elems[0xe] ==
                          (puVar2->super_base_blob<256U>).m_data._M_elems[0xe]);
          auVar21[0xf] = -(puVar5[-1].super_base_blob<256U>.m_data._M_elems[0xf] ==
                          (puVar2->super_base_blob<256U>).m_data._M_elems[0xf]);
          auVar18[0] = -(puVar5[-1].super_base_blob<256U>.m_data._M_elems[0x10] == *puVar4);
          auVar18[1] = -(puVar5[-1].super_base_blob<256U>.m_data._M_elems[0x11] == puVar4[1]);
          auVar18[2] = -(puVar5[-1].super_base_blob<256U>.m_data._M_elems[0x12] == puVar4[2]);
          auVar18[3] = -(puVar5[-1].super_base_blob<256U>.m_data._M_elems[0x13] == puVar4[3]);
          auVar18[4] = -(puVar5[-1].super_base_blob<256U>.m_data._M_elems[0x14] == puVar4[4]);
          auVar18[5] = -(puVar5[-1].super_base_blob<256U>.m_data._M_elems[0x15] == puVar4[5]);
          auVar18[6] = -(puVar5[-1].super_base_blob<256U>.m_data._M_elems[0x16] == puVar4[6]);
          auVar18[7] = -(puVar5[-1].super_base_blob<256U>.m_data._M_elems[0x17] == puVar4[7]);
          auVar18[8] = -(puVar5[-1].super_base_blob<256U>.m_data._M_elems[0x18] == puVar4[8]);
          auVar18[9] = -(puVar5[-1].super_base_blob<256U>.m_data._M_elems[0x19] == puVar4[9]);
          auVar18[10] = -(puVar5[-1].super_base_blob<256U>.m_data._M_elems[0x1a] == puVar4[10]);
          auVar18[0xb] = -(puVar5[-1].super_base_blob<256U>.m_data._M_elems[0x1b] == puVar4[0xb]);
          auVar18[0xc] = -(puVar5[-1].super_base_blob<256U>.m_data._M_elems[0x1c] == puVar4[0xc]);
          auVar18[0xd] = -(puVar5[-1].super_base_blob<256U>.m_data._M_elems[0x1d] == puVar4[0xd]);
          auVar18[0xe] = -(puVar5[-1].super_base_blob<256U>.m_data._M_elems[0x1e] == puVar4[0xe]);
          auVar18[0xf] = -(puVar5[-1].super_base_blob<256U>.m_data._M_elems[0x1f] == puVar4[0xf]);
          auVar18 = auVar18 & auVar21;
          if ((ushort)((ushort)(SUB161(auVar18 >> 7,0) & 1) |
                       (ushort)(SUB161(auVar18 >> 0xf,0) & 1) << 1 |
                       (ushort)(SUB161(auVar18 >> 0x17,0) & 1) << 2 |
                       (ushort)(SUB161(auVar18 >> 0x1f,0) & 1) << 3 |
                       (ushort)(SUB161(auVar18 >> 0x27,0) & 1) << 4 |
                       (ushort)(SUB161(auVar18 >> 0x2f,0) & 1) << 5 |
                       (ushort)(SUB161(auVar18 >> 0x37,0) & 1) << 6 |
                       (ushort)(SUB161(auVar18 >> 0x3f,0) & 1) << 7 |
                       (ushort)(SUB161(auVar18 >> 0x47,0) & 1) << 8 |
                       (ushort)(SUB161(auVar18 >> 0x4f,0) & 1) << 9 |
                       (ushort)(SUB161(auVar18 >> 0x57,0) & 1) << 10 |
                       (ushort)(SUB161(auVar18 >> 0x5f,0) & 1) << 0xb |
                       (ushort)(SUB161(auVar18 >> 0x67,0) & 1) << 0xc |
                       (ushort)(SUB161(auVar18 >> 0x6f,0) & 1) << 0xd |
                       (ushort)(SUB161(auVar18 >> 0x77,0) & 1) << 0xe |
                      (ushort)(byte)(auVar18[0xf] >> 7) << 0xf) == 0xffff) {
            bVar13 = true;
          }
          else {
            lVar7 = 4;
            do {
              bVar13 = lVar7 != 0x20;
              if (lVar7 == 0x20) goto LAB_003711f5;
              uVar9 = (ulong)*(uint *)((long)&local_58._vptr_lazy_ostream + lVar7);
              puVar2 = local_b8.table.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                       super__Vector_impl_data._M_start + uVar9;
              puVar4 = local_b8.table.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                       super__Vector_impl_data._M_start[uVar9].super_base_blob<256U>.m_data._M_elems
                       + 0x10;
              auVar22[0] = -(puVar5[-1].super_base_blob<256U>.m_data._M_elems[0] ==
                            (puVar2->super_base_blob<256U>).m_data._M_elems[0]);
              auVar22[1] = -(puVar5[-1].super_base_blob<256U>.m_data._M_elems[1] ==
                            (puVar2->super_base_blob<256U>).m_data._M_elems[1]);
              auVar22[2] = -(puVar5[-1].super_base_blob<256U>.m_data._M_elems[2] ==
                            (puVar2->super_base_blob<256U>).m_data._M_elems[2]);
              auVar22[3] = -(puVar5[-1].super_base_blob<256U>.m_data._M_elems[3] ==
                            (puVar2->super_base_blob<256U>).m_data._M_elems[3]);
              auVar22[4] = -(puVar5[-1].super_base_blob<256U>.m_data._M_elems[4] ==
                            (puVar2->super_base_blob<256U>).m_data._M_elems[4]);
              auVar22[5] = -(puVar5[-1].super_base_blob<256U>.m_data._M_elems[5] ==
                            (puVar2->super_base_blob<256U>).m_data._M_elems[5]);
              auVar22[6] = -(puVar5[-1].super_base_blob<256U>.m_data._M_elems[6] ==
                            (puVar2->super_base_blob<256U>).m_data._M_elems[6]);
              auVar22[7] = -(puVar5[-1].super_base_blob<256U>.m_data._M_elems[7] ==
                            (puVar2->super_base_blob<256U>).m_data._M_elems[7]);
              auVar22[8] = -(puVar5[-1].super_base_blob<256U>.m_data._M_elems[8] ==
                            (puVar2->super_base_blob<256U>).m_data._M_elems[8]);
              auVar22[9] = -(puVar5[-1].super_base_blob<256U>.m_data._M_elems[9] ==
                            (puVar2->super_base_blob<256U>).m_data._M_elems[9]);
              auVar22[10] = -(puVar5[-1].super_base_blob<256U>.m_data._M_elems[10] ==
                             (puVar2->super_base_blob<256U>).m_data._M_elems[10]);
              auVar22[0xb] = -(puVar5[-1].super_base_blob<256U>.m_data._M_elems[0xb] ==
                              (puVar2->super_base_blob<256U>).m_data._M_elems[0xb]);
              auVar22[0xc] = -(puVar5[-1].super_base_blob<256U>.m_data._M_elems[0xc] ==
                              (puVar2->super_base_blob<256U>).m_data._M_elems[0xc]);
              auVar22[0xd] = -(puVar5[-1].super_base_blob<256U>.m_data._M_elems[0xd] ==
                              (puVar2->super_base_blob<256U>).m_data._M_elems[0xd]);
              auVar22[0xe] = -(puVar5[-1].super_base_blob<256U>.m_data._M_elems[0xe] ==
                              (puVar2->super_base_blob<256U>).m_data._M_elems[0xe]);
              auVar22[0xf] = -(puVar5[-1].super_base_blob<256U>.m_data._M_elems[0xf] ==
                              (puVar2->super_base_blob<256U>).m_data._M_elems[0xf]);
              auVar19[0] = -(puVar5[-1].super_base_blob<256U>.m_data._M_elems[0x10] == *puVar4);
              auVar19[1] = -(puVar5[-1].super_base_blob<256U>.m_data._M_elems[0x11] == puVar4[1]);
              auVar19[2] = -(puVar5[-1].super_base_blob<256U>.m_data._M_elems[0x12] == puVar4[2]);
              auVar19[3] = -(puVar5[-1].super_base_blob<256U>.m_data._M_elems[0x13] == puVar4[3]);
              auVar19[4] = -(puVar5[-1].super_base_blob<256U>.m_data._M_elems[0x14] == puVar4[4]);
              auVar19[5] = -(puVar5[-1].super_base_blob<256U>.m_data._M_elems[0x15] == puVar4[5]);
              auVar19[6] = -(puVar5[-1].super_base_blob<256U>.m_data._M_elems[0x16] == puVar4[6]);
              auVar19[7] = -(puVar5[-1].super_base_blob<256U>.m_data._M_elems[0x17] == puVar4[7]);
              auVar19[8] = -(puVar5[-1].super_base_blob<256U>.m_data._M_elems[0x18] == puVar4[8]);
              auVar19[9] = -(puVar5[-1].super_base_blob<256U>.m_data._M_elems[0x19] == puVar4[9]);
              auVar19[10] = -(puVar5[-1].super_base_blob<256U>.m_data._M_elems[0x1a] == puVar4[10]);
              auVar19[0xb] = -(puVar5[-1].super_base_blob<256U>.m_data._M_elems[0x1b] == puVar4[0xb]
                              );
              auVar19[0xc] = -(puVar5[-1].super_base_blob<256U>.m_data._M_elems[0x1c] == puVar4[0xc]
                              );
              auVar19[0xd] = -(puVar5[-1].super_base_blob<256U>.m_data._M_elems[0x1d] == puVar4[0xd]
                              );
              auVar19[0xe] = -(puVar5[-1].super_base_blob<256U>.m_data._M_elems[0x1e] == puVar4[0xe]
                              );
              auVar19[0xf] = -(puVar5[-1].super_base_blob<256U>.m_data._M_elems[0x1f] == puVar4[0xf]
                              );
              auVar19 = auVar19 & auVar22;
              lVar7 = lVar7 + 4;
            } while ((ushort)((ushort)(SUB161(auVar19 >> 7,0) & 1) |
                              (ushort)(SUB161(auVar19 >> 0xf,0) & 1) << 1 |
                              (ushort)(SUB161(auVar19 >> 0x17,0) & 1) << 2 |
                              (ushort)(SUB161(auVar19 >> 0x1f,0) & 1) << 3 |
                              (ushort)(SUB161(auVar19 >> 0x27,0) & 1) << 4 |
                              (ushort)(SUB161(auVar19 >> 0x2f,0) & 1) << 5 |
                              (ushort)(SUB161(auVar19 >> 0x37,0) & 1) << 6 |
                              (ushort)(SUB161(auVar19 >> 0x3f,0) & 1) << 7 |
                              (ushort)(SUB161(auVar19 >> 0x47,0) & 1) << 8 |
                              (ushort)(SUB161(auVar19 >> 0x4f,0) & 1) << 9 |
                              (ushort)(SUB161(auVar19 >> 0x57,0) & 1) << 10 |
                              (ushort)(SUB161(auVar19 >> 0x5f,0) & 1) << 0xb |
                              (ushort)(SUB161(auVar19 >> 0x67,0) & 1) << 0xc |
                              (ushort)(SUB161(auVar19 >> 0x6f,0) & 1) << 0xd |
                              (ushort)(SUB161(auVar19 >> 0x77,0) & 1) << 0xe |
                             (ushort)(byte)(auVar19[0xf] >> 7) << 0xf) != 0xffff);
          }
          LOCK();
          paVar3 = (atomic<unsigned_char> *)
                   ((long)local_b8.collection_flags.mem._M_t.
                          super___uniq_ptr_impl<std::atomic<unsigned_char>,_std::default_delete<std::atomic<unsigned_char>[]>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::atomic<unsigned_char>_*,_std::default_delete<std::atomic<unsigned_char>[]>_>
                          .super__Head_base<0UL,_std::atomic<unsigned_char>_*,_false>._M_head_impl +
                   (uVar9 >> 3));
          (paVar3->super___atomic_base<unsigned_char>)._M_i =
               (paVar3->super___atomic_base<unsigned_char>)._M_i | (byte)(1 << ((byte)uVar9 & 7));
          UNLOCK();
LAB_003711f5:
          ppuVar1 = &(pbVar6->reads).super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                     super__Vector_impl_data._M_finish;
          *ppuVar1 = *ppuVar1 + -1;
          uVar10 = uVar10 + bVar13;
          uVar12 = (int)in_R9 + 1;
          in_R9 = (iterator)(ulong)uVar12;
        } while (uVar12 != 8);
        pbVar6 = pbVar6 + 1;
        if (pbVar6 == in_R8) {
          pbVar6 = ppbVar11[1];
          ppbVar11 = ppbVar11 + 1;
          in_R8 = pbVar6 + 0x15;
        }
      } while (pbVar6 != local_128._M_impl.super__Deque_impl_data._M_finish._M_cur);
      dVar17 = (double)uVar10;
    }
    lVar7 = (((ulong)((long)local_128._M_impl.super__Deque_impl_data._M_start._M_last -
                     (long)local_128._M_impl.super__Deque_impl_data._M_start._M_cur) >> 3) *
             -0x5555555555555555 +
             ((ulong)((long)local_128._M_impl.super__Deque_impl_data._M_finish._M_cur -
                     (long)local_128._M_impl.super__Deque_impl_data._M_finish._M_first) >> 3) *
             -0x5555555555555555 +
            ((((ulong)((long)local_128._M_impl.super__Deque_impl_data._M_finish._M_node -
                      (long)local_128._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) - 1) +
            (ulong)(local_128._M_impl.super__Deque_impl_data._M_finish._M_node == (_Map_pointer)0x0)
            ) * 0x15) * 8;
    auVar20._8_4_ = (int)((ulong)lVar7 >> 0x20);
    auVar20._0_8_ = lVar7;
    auVar20._12_4_ = 0x45300000;
    local_138 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/cuckoocache_tests.cpp"
    ;
    local_130 = "";
    local_148 = &boost::unit_test::basic_cstring<char_const>::null;
    local_140 = &boost::unit_test::basic_cstring<char_const>::null;
    file.m_end = (iterator)0x16e;
    file.m_begin = (iterator)&local_138;
    msg.m_end = in_R9;
    msg.m_begin = (iterator)in_R8;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_148,msg);
    dVar17 = dVar17 / ((auVar20._8_8_ - 1.9342813113834067e+25) +
                      ((double)CONCAT44(0x43300000,(int)lVar7) - 4503599627370496.0));
    local_160.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)(0.99 < dVar17);
    local_160.m_message.px = (element_type *)0x0;
    local_160.m_message.pn.pi_ = (sp_counted_base *)0x0;
    local_170 = "hit > min_hit_rate";
    local_168 = "";
    local_58._8_4_ = local_58._8_4_ & 0xffffff00;
    local_58._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013d3df0;
    local_48 = boost::unit_test::lazy_ostream::inst;
    local_40 = &local_170;
    local_180 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/cuckoocache_tests.cpp"
    ;
    local_178 = "";
    in_R8 = (_Elt_pointer)0x1;
    in_R9 = (iterator)0x0;
    boost::test_tools::tt_detail::report_assertion
              (&local_160,&local_58,1,0,WARN,_cVar23,(size_t)&local_180,0x16e,dVar17);
    boost::detail::shared_count::~shared_count(&local_160.m_message.pn);
    uVar16 = uVar16 + (dVar17 < 0.999);
    iVar15 = iVar15 + 1;
    if (iVar15 == 0x51e) {
      local_190 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/cuckoocache_tests.cpp"
      ;
      local_188 = "";
      local_1a0 = &boost::unit_test::basic_cstring<char_const>::null;
      local_198 = &boost::unit_test::basic_cstring<char_const>::null;
      file_00.m_end = (iterator)0x175;
      file_00.m_begin = (iterator)&local_190;
      msg_00.m_end = in_R9;
      msg_00.m_begin = (iterator)in_R8;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_1a0,
                 msg_00);
      local_160.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
           (readonly_property<bool>)((double)uVar16 / 1310.0 < 0.01);
      local_160.m_message.px = (element_type *)0x0;
      local_160.m_message.pn.pi_ = (sp_counted_base *)0x0;
      local_170 = 
      "double(out_of_tight_tolerance) / double(total) < max_rate_less_than_tight_hit_rate";
      local_168 = "";
      local_58._8_4_ = local_58._8_4_ & 0xffffff00;
      local_58._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013d3df0;
      local_48 = boost::unit_test::lazy_ostream::inst;
      local_40 = &local_170;
      local_1b0 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/cuckoocache_tests.cpp"
      ;
      local_1a8 = "";
      boost::test_tools::tt_detail::report_assertion
                (&local_160,&local_58,1,0,WARN,_cVar23,(size_t)&local_1b0,0x175);
      boost::detail::shared_count::~shared_count(&local_160.m_message.pn);
      std::deque<block_activity,_std::allocator<block_activity>_>::~deque
                ((deque<block_activity,_std::allocator<block_activity>_> *)&local_128);
      if (local_b8.epoch_flags.super__Bvector_base<std::allocator<bool>_>._M_impl.
          super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
        operator_delete(local_b8.epoch_flags.super__Bvector_base<std::allocator<bool>_>._M_impl.
                        super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                        (long)local_b8.epoch_flags.super__Bvector_base<std::allocator<bool>_>.
                              _M_impl.super__Bvector_impl_data._M_end_of_storage -
                        (long)local_b8.epoch_flags.super__Bvector_base<std::allocator<bool>_>.
                              _M_impl.super__Bvector_impl_data._M_start.super__Bit_iterator_base.
                              _M_p);
        local_b8.epoch_flags.super__Bvector_base<std::allocator<bool>_>._M_impl.
        super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
        local_b8.epoch_flags.super__Bvector_base<std::allocator<bool>_>._M_impl.
        super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset = 0;
        local_b8.epoch_flags.super__Bvector_base<std::allocator<bool>_>._M_impl.
        super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
        local_b8.epoch_flags.super__Bvector_base<std::allocator<bool>_>._M_impl.
        super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset = 0;
        local_b8.epoch_flags.super__Bvector_base<std::allocator<bool>_>._M_impl.
        super__Bvector_impl_data._M_end_of_storage = (_Bit_pointer)0x0;
      }
      if (local_b8.collection_flags.mem._M_t.
          super___uniq_ptr_impl<std::atomic<unsigned_char>,_std::default_delete<std::atomic<unsigned_char>[]>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::atomic<unsigned_char>_*,_std::default_delete<std::atomic<unsigned_char>[]>_>
          .super__Head_base<0UL,_std::atomic<unsigned_char>_*,_false>._M_head_impl !=
          (__uniq_ptr_data<std::atomic<unsigned_char>,_std::default_delete<std::atomic<unsigned_char>[]>,_true,_true>
           )0x0) {
        operator_delete__((void *)local_b8.collection_flags.mem._M_t.
                                  super___uniq_ptr_impl<std::atomic<unsigned_char>,_std::default_delete<std::atomic<unsigned_char>[]>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_std::atomic<unsigned_char>_*,_std::default_delete<std::atomic<unsigned_char>[]>_>
                                  .super__Head_base<0UL,_std::atomic<unsigned_char>_*,_false>.
                                  _M_head_impl);
      }
      local_b8.collection_flags.mem._M_t.
      super___uniq_ptr_impl<std::atomic<unsigned_char>,_std::default_delete<std::atomic<unsigned_char>[]>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::atomic<unsigned_char>_*,_std::default_delete<std::atomic<unsigned_char>[]>_>
      .super__Head_base<0UL,_std::atomic<unsigned_char>_*,_false>._M_head_impl =
           (unique_ptr<std::atomic<unsigned_char>[],_std::default_delete<std::atomic<unsigned_char>[]>_>
            )(__uniq_ptr_data<std::atomic<unsigned_char>,_std::default_delete<std::atomic<unsigned_char>[]>,_true,_true>
              )0x0;
      if (local_b8.table.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_b8.table.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl
                        .super__Vector_impl_data._M_start,
                        (long)local_b8.table.super__Vector_base<uint256,_std::allocator<uint256>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_b8.table.super__Vector_base<uint256,_std::allocator<uint256>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      std::vector<block_activity,_std::allocator<block_activity>_>::~vector(&local_d8);
      if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
        __stack_chk_fail();
      }
      return;
    }
  } while( true );
}

Assistant:

void test_cache_generations()
{
    // This test checks that for a simulation of network activity, the fresh hit
    // rate is never below 99%, and the number of times that it is worse than
    // 99.9% are less than 1% of the time.
    double min_hit_rate = 0.99;
    double tight_hit_rate = 0.999;
    double max_rate_less_than_tight_hit_rate = 0.01;
    // A cache that meets this specification is therefore shown to have a hit
    // rate of at least tight_hit_rate * (1 - max_rate_less_than_tight_hit_rate) +
    // min_hit_rate*max_rate_less_than_tight_hit_rate = 0.999*99%+0.99*1% == 99.89%
    // hit rate with low variance.

    // We use deterministic values, but this test has also passed on many
    // iterations with non-deterministic values, so it isn't "overfit" to the
    // specific entropy in FastRandomContext(true) and implementation of the
    // cache.
    SeedRandomForTest(SeedRand::ZEROS);

    // block_activity models a chunk of network activity. n_insert elements are
    // added to the cache. The first and last n/4 are stored for removal later
    // and the middle n/2 are not stored. This models a network which uses half
    // the signatures of recently (since the last block) added transactions
    // immediately and never uses the other half.
    struct block_activity {
        std::vector<uint256> reads;
        block_activity(uint32_t n_insert, FastRandomContext& rng, Cache& c)
        {
            std::vector<uint256> inserts;
            inserts.resize(n_insert);
            reads.reserve(n_insert / 2);
            for (uint32_t i = 0; i < n_insert; ++i) {
                uint32_t* ptr = (uint32_t*)inserts[i].begin();
                for (uint8_t j = 0; j < 8; ++j)
                    *(ptr++) = rng.rand32();
            }
            for (uint32_t i = 0; i < n_insert / 4; ++i)
                reads.push_back(inserts[i]);
            for (uint32_t i = n_insert - (n_insert / 4); i < n_insert; ++i)
                reads.push_back(inserts[i]);
            for (const auto& h : inserts)
                c.insert(h);
        }
    };

    const uint32_t BLOCK_SIZE = 1000;
    // We expect window size 60 to perform reasonably given that each epoch
    // stores 45% of the cache size (~472k).
    const uint32_t WINDOW_SIZE = 60;
    const uint32_t POP_AMOUNT = (BLOCK_SIZE / WINDOW_SIZE) / 2;
    const double load = 10;
    const size_t megabytes = 4;
    const size_t bytes = megabytes * (1 << 20);
    const uint32_t n_insert = static_cast<uint32_t>(load * (bytes / sizeof(uint256)));

    std::vector<block_activity> hashes;
    Cache set{};
    set.setup_bytes(bytes);
    hashes.reserve(n_insert / BLOCK_SIZE);
    std::deque<block_activity> last_few;
    uint32_t out_of_tight_tolerance = 0;
    uint32_t total = n_insert / BLOCK_SIZE;
    // we use the deque last_few to model a sliding window of blocks. at each
    // step, each of the last WINDOW_SIZE block_activities checks the cache for
    // POP_AMOUNT of the hashes that they inserted, and marks these erased.
    for (uint32_t i = 0; i < total; ++i) {
        if (last_few.size() == WINDOW_SIZE)
            last_few.pop_front();
        last_few.emplace_back(BLOCK_SIZE, m_rng, set);
        uint32_t count = 0;
        for (auto& act : last_few)
            for (uint32_t k = 0; k < POP_AMOUNT; ++k) {
                count += set.contains(act.reads.back(), true);
                act.reads.pop_back();
            }
        // We use last_few.size() rather than WINDOW_SIZE for the correct
        // behavior on the first WINDOW_SIZE iterations where the deque is not
        // full yet.
        double hit = (double(count)) / (last_few.size() * POP_AMOUNT);
        // Loose Check that hit rate is above min_hit_rate
        BOOST_CHECK(hit > min_hit_rate);
        // Tighter check, count number of times we are less than tight_hit_rate
        // (and implicitly, greater than min_hit_rate)
        out_of_tight_tolerance += hit < tight_hit_rate;
    }
    // Check that being out of tolerance happens less than
    // max_rate_less_than_tight_hit_rate of the time
    BOOST_CHECK(double(out_of_tight_tolerance) / double(total) < max_rate_less_than_tight_hit_rate);
}